

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  string *psVar8;
  long lVar9;
  void **ppvVar10;
  
  sVar7 = (size_t)(this->features_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->features_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar1 = sVar7 * 8;
  for (lVar9 = 0; lVar1 - lVar9 != 0; lVar9 = lVar9 + 8) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                      (*(BayesianProbitRegressor_FeatureWeight **)((long)ppvVar10 + lVar9));
    sVar7 = sVar7 + sVar6;
  }
  psVar8 = (string *)
           ((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 1;
  }
  psVar8 = (string *)
           ((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 1;
  }
  psVar8 = (string *)
           ((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 1;
  }
  psVar8 = (string *)
           ((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
           );
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 1;
  }
  psVar8 = (string *)((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 2;
  }
  psVar8 = (string *)
           ((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 2;
  }
  psVar8 = (string *)
           ((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 2;
  }
  psVar8 = (string *)
           ((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  if (psVar8->_M_string_length != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar8);
    sVar7 = sVar7 + sVar6 + 2;
  }
  if (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_Gaussian>(this->bias_);
    sVar7 = sVar7 + sVar6 + 1;
  }
  if (this->numberoffeatures_ != 0) {
    uVar5 = this->numberoffeatures_ | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar7 = sVar7 + (iVar4 * 9 + 0x89U >> 6);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar7 = sVar7 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar7;
  return sVar7;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  total_size += 1UL * this->_internal_features_size();
  for (const auto& msg : this->features_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32SizePlusOne(this->_internal_numberoffeatures());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}